

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::python::(anonymous_namespace)::StringifySyntax_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Syntax syntax)

{
  LogMessage *other;
  allocator local_62;
  LogFinisher local_61;
  LogMessage local_60;
  allocator local_25 [16];
  allocator local_15;
  int local_14;
  string *psStack_10;
  Syntax syntax_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 != 0) {
    if (local_14 == 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"proto2",&local_15);
      std::allocator<char>::~allocator((allocator<char> *)&local_15);
      return __return_storage_ptr__;
    }
    if (local_14 == 3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"proto3",local_25);
      std::allocator<char>::~allocator((allocator<char> *)local_25);
      return __return_storage_ptr__;
    }
  }
  internal::LogMessage::LogMessage
            (&local_60,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/python/python_generator.cc"
             ,0x123);
  other = internal::LogMessage::operator<<
                    (&local_60,
                     "Unsupported syntax; this generator only supports proto2 and proto3 syntax.");
  internal::LogFinisher::operator=(&local_61,other);
  internal::LogMessage::~LogMessage(&local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_62);
  std::allocator<char>::~allocator((allocator<char> *)&local_62);
  return __return_storage_ptr__;
}

Assistant:

string StringifySyntax(FileDescriptor::Syntax syntax) {
  switch (syntax) {
    case FileDescriptor::SYNTAX_PROTO2:
      return "proto2";
    case FileDescriptor::SYNTAX_PROTO3:
      return "proto3";
    case FileDescriptor::SYNTAX_UNKNOWN:
    default:
      GOOGLE_LOG(FATAL) << "Unsupported syntax; this generator only supports proto2 "
                    "and proto3 syntax.";
      return "";
  }
}